

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_elements_base_vertex
               (NegativeTestContext *ctx)

{
  bool bVar1;
  deBool dVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  NotSupportedError *this;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  undefined1 local_2c [4];
  GLuint local_28;
  GLfloat vertices [1];
  GLuint fbo;
  NegativeTestContext *ctx_local;
  
  while( true ) {
    dVar2 = ::deGetFalse();
    if (dVar2 != 0) break;
    pRVar3 = NegativeTestContext::getRenderContext(ctx);
    ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    requiredApiType = glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(ctxType,requiredApiType);
    if (!bVar1) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      local_28 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "GL_INVALID_ENUM is generated if mode is not an accepted value.",&local_51);
      NegativeTestContext::beginSection(ctx,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      glu::CallLogWrapper::glDrawElementsBaseVertex
                (&ctx->super_CallLogWrapper,0xffffffff,1,0x1405,local_2c,1);
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "GL_INVALID_ENUM is generated if type is not one of the accepted values.",&local_79
                );
      NegativeTestContext::beginSection(ctx,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      glu::CallLogWrapper::glDrawElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,1,0xffffffff,local_2c,1);
      NegativeTestContext::expectError(ctx,0x500);
      glu::CallLogWrapper::glDrawElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,1,0x1406,local_2c,1);
      NegativeTestContext::expectError(ctx,0x500);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"GL_INVALID_VALUE is generated if count is negative.",&local_a1
                );
      NegativeTestContext::beginSection(ctx,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      glu::CallLogWrapper::glDrawElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,-1,0x1405,local_2c,1);
      NegativeTestContext::expectError(ctx,0x501);
      NegativeTestContext::endSection(ctx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,
                 "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
                 ,&local_c9);
      NegativeTestContext::beginSection(ctx,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&local_28);
      glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,local_28);
      glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
      glu::CallLogWrapper::glDrawElementsBaseVertex
                (&ctx->super_CallLogWrapper,0,1,0x1405,local_2c,1);
      NegativeTestContext::expectError(ctx,0x506);
      glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
      glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&local_28);
      NegativeTestContext::endSection(ctx);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a 3.2 context or higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeVertexArrayApiTests.cpp"
             ,0x29f);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void draw_elements_base_vertex (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a 3.2 context or higher context version.");

	GLuint				fbo = 0;
	GLfloat				vertices[1];

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawElementsBaseVertex(-1, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawElementsBaseVertex(GL_POINTS, 1, -1, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawElementsBaseVertex(GL_POINTS, 1, GL_FLOAT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count is negative.");
	ctx.glDrawElementsBaseVertex(GL_POINTS, -1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawElementsBaseVertex(GL_POINTS, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();
}